

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowpassSpeaker.hpp
# Opt level: O3

void __thiscall
Outputs::Speaker::LowpassBase<Outputs::Speaker::PullLowpass<GI::AY38910::AY38910<false>_>,_false>::
set_input_rate(LowpassBase<Outputs::Speaker::PullLowpass<GI::AY38910::AY38910<false>_>,_false> *this
              ,float cycles_per_second)

{
  float fVar1;
  int iVar2;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->filter_parameters_mutex_);
  if (iVar2 == 0) {
    fVar1 = (this->filter_parameters_).input_cycles_per_second;
    if ((fVar1 != cycles_per_second) || (NAN(fVar1) || NAN(cycles_per_second))) {
      (this->filter_parameters_).input_cycles_per_second = cycles_per_second;
      (this->filter_parameters_).parameters_are_dirty = true;
      (this->filter_parameters_).input_rate_changed = true;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->filter_parameters_mutex_);
    return;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

void set_input_rate(float cycles_per_second) {
			std::lock_guard lock_guard(filter_parameters_mutex_);
			if(filter_parameters_.input_cycles_per_second == cycles_per_second) {
				return;
			}
			filter_parameters_.input_cycles_per_second = cycles_per_second;
			filter_parameters_.parameters_are_dirty = true;
			filter_parameters_.input_rate_changed = true;
		}